

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<VectorWriter,unsigned_int,unsigned_long>
               (VectorWriter *s,uint *args,unsigned_long *args_1)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  unsigned_long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = CONCAT44(local_28._4_4_,*args);
  VectorWriter::write(s,(int)&local_28,(void *)0x4,in_RCX);
  local_28 = *args_1;
  VectorWriter::write(s,(int)&local_28,&DAT_00000008,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}